

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestImplicitOutputOnlyMissing::Run(GraphTestImplicitOutputOnlyMissing *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  bool condition;
  int iVar4;
  Node *pNVar5;
  allocator<char> local_e9;
  string local_e8;
  uint local_c8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string err;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  GraphTestImplicitOutputOnlyMissing *pGStack_10;
  int fail_count;
  GraphTestImplicitOutputOnlyMissing *this_local;
  
  pGStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build | out.imp: cat in\n",local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::__cxx11::string::string((string *)local_a0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"out.imp",&local_c1);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_c0);
    bVar3 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,pNVar5,(string *)local_a0)
    ;
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/graph_test.cc"
               ,0xa3,"scan_.RecomputeDirty(GetNode(\"out.imp\"), &err)");
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/graph_test.cc"
                       ,0xa4,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"out.imp",&local_e9);
      pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_e8);
      condition = Node::dirty(pNVar5);
      testing::Test::Check
                (pTVar1,condition,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/graph_test.cc"
                 ,0xa6,"GetNode(\"out.imp\")->dirty()");
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    local_c8 = (uint)!bVar3;
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(GraphTest, ImplicitOutputOnlyMissing) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build | out.imp: cat in\n"));
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.imp"), &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(GetNode("out.imp")->dirty());
}